

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O3

size_t ZSTD_compress_usingDict
                 (ZSTD_CCtx *cctx,void *dst,size_t dstCapacity,void *src,size_t srcSize,void *dict,
                 size_t dictSize,int compressionLevel)

{
  size_t sVar1;
  ZSTD_useRowMatchFinderMode_e ZVar2;
  int iVar3;
  ZSTD_compressionParameters cParams;
  
  sVar1 = dictSize;
  if (dict == (void *)0x0) {
    sVar1 = 0;
  }
  ZSTD_getCParams_internal(&cParams,compressionLevel,srcSize,sVar1,ZSTD_cpm_noAttachDict);
  iVar3 = 3;
  if (compressionLevel != 0) {
    iVar3 = compressionLevel;
  }
  memset(&cctx->simpleApiParams,0,0xb0);
  (cctx->simpleApiParams).cParams.windowLog = cParams.windowLog;
  (cctx->simpleApiParams).cParams.chainLog = cParams.chainLog;
  (cctx->simpleApiParams).cParams.hashLog = cParams.hashLog;
  (cctx->simpleApiParams).cParams.searchLog = cParams.searchLog;
  (cctx->simpleApiParams).cParams.minMatch = cParams.minMatch;
  (cctx->simpleApiParams).cParams.targetLength = cParams.targetLength;
  (cctx->simpleApiParams).cParams.strategy = cParams.strategy;
  (cctx->simpleApiParams).fParams.contentSizeFlag = 1;
  (cctx->simpleApiParams).compressionLevel = iVar3;
  ZVar2 = ZSTD_urm_enableRowMatchFinder - (cParams.windowLog < 0xf);
  if (cParams.strategy - ZSTD_btlazy2 < 0xfffffffd) {
    ZVar2 = ZSTD_urm_disableRowMatchFinder;
  }
  (cctx->simpleApiParams).useRowMatchFinder = ZVar2;
  sVar1 = ZSTD_compress_advanced_internal
                    (cctx,dst,dstCapacity,src,srcSize,dict,dictSize,&cctx->simpleApiParams);
  return sVar1;
}

Assistant:

size_t ZSTD_compress_usingDict(ZSTD_CCtx* cctx,
                               void* dst, size_t dstCapacity,
                         const void* src, size_t srcSize,
                         const void* dict, size_t dictSize,
                               int compressionLevel)
{
    {
        ZSTD_parameters const params = ZSTD_getParams_internal(compressionLevel, srcSize, dict ? dictSize : 0, ZSTD_cpm_noAttachDict);
        assert(params.fParams.contentSizeFlag == 1);
        ZSTD_CCtxParams_init_internal(&cctx->simpleApiParams, &params, (compressionLevel == 0) ? ZSTD_CLEVEL_DEFAULT: compressionLevel);
    }
    DEBUGLOG(4, "ZSTD_compress_usingDict (srcSize=%u)", (unsigned)srcSize);
    return ZSTD_compress_advanced_internal(cctx, dst, dstCapacity, src, srcSize, dict, dictSize, &cctx->simpleApiParams);
}